

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint in_EDX;
  long in_RSI;
  vq_node *in_RDI;
  vq_node *pDst;
  vq_node *pSrc_end;
  vq_node *pSrc;
  vq_node *in_stack_ffffffffffffffc8;
  long local_20;
  
  for (local_20 = in_RSI; local_20 != in_RSI + (ulong)in_EDX * 0x68; local_20 = local_20 + 0x68) {
    tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node::vq_node(in_RDI,in_stack_ffffffffffffffc8);
    in_RDI = in_RDI + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }